

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O0

void __thiscall
Js::DiagNativeStackFrame::DiagNativeStackFrame
          (DiagNativeStackFrame *this,ScriptFunction *function,int byteCodeOffset,void *stackAddr,
          void *codeAddr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *pSVar4;
  FunctionBody *this_00;
  FunctionEntryPointInfo *pFVar5;
  FunctionEntryPointInfo *entryPointInfo;
  void *codeAddr_local;
  void *stackAddr_local;
  int byteCodeOffset_local;
  ScriptFunction *function_local;
  DiagNativeStackFrame *this_local;
  
  DiagStackFrame::DiagStackFrame(&this->super_DiagStackFrame);
  (this->super_DiagStackFrame)._vptr_DiagStackFrame =
       (_func_int **)&PTR__DiagNativeStackFrame_01ded490;
  this->m_function = function;
  this->m_byteCodeOffset = byteCodeOffset;
  this->m_stackAddr = stackAddr;
  this->m_localVarSlotsOffset = -1;
  this->m_localVarChangedOffset = -1;
  if (this->m_stackAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x1ef,"(m_stackAddr != __null)","m_stackAddr != NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((this->m_function != (ScriptFunction *)0x0) &&
     (pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this->m_function),
     pSVar4 != (ScriptContext *)0x0)) {
    pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this->m_function);
    bVar2 = ScriptContext::IsScriptContextInDebugMode(pSVar4);
    if (bVar2) goto LAB_00c86ed2;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                              ,0x1f1,
                              "(m_function && m_function->GetScriptContext() && m_function->GetScriptContext()->IsScriptContextInDebugMode())"
                              ,"This only supports functions in debug mode.");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 0;
LAB_00c86ed2:
  this_00 = DiagStackFrame::GetFunction(&this->super_DiagStackFrame);
  pFVar5 = FunctionBody::GetEntryPointFromNativeAddress(this_00,(DWORD_PTR)codeAddr);
  if (pFVar5 == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x1fb,"(0)",
                                "Failed to get entry point for native address. Most likely the frame is old/gone."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  else {
    this->m_localVarSlotsOffset = pFVar5->localVarSlotsOffset;
    this->m_localVarChangedOffset = pFVar5->localVarChangedOffset;
  }
  Output::Trace(DebuggerPhase,
                L"DiagNativeStackFrame::DiagNativeStackFrame: e.p(addr %p)=%p varOff=%d changedOff=%d\n"
                ,codeAddr,pFVar5,(ulong)(uint)this->m_localVarSlotsOffset,
                (ulong)(uint)this->m_localVarChangedOffset);
  return;
}

Assistant:

DiagNativeStackFrame::DiagNativeStackFrame(
        ScriptFunction* function,
        int byteCodeOffset,
        void* stackAddr,
        void *codeAddr) :
        m_function(function),
        m_byteCodeOffset(byteCodeOffset),
        m_stackAddr(stackAddr),
        m_localVarSlotsOffset(InvalidOffset),
        m_localVarChangedOffset(InvalidOffset)
    {
        Assert(m_stackAddr != NULL);
        AssertMsg(m_function && m_function->GetScriptContext() && m_function->GetScriptContext()->IsScriptContextInDebugMode(),
            "This only supports functions in debug mode.");

        FunctionEntryPointInfo * entryPointInfo = GetFunction()->GetEntryPointFromNativeAddress((DWORD_PTR)codeAddr);
        if (entryPointInfo)
        {
            m_localVarSlotsOffset = entryPointInfo->localVarSlotsOffset;
            m_localVarChangedOffset = entryPointInfo->localVarChangedOffset;
        }
        else
        {
            AssertMsg(FALSE, "Failed to get entry point for native address. Most likely the frame is old/gone.");
        }
        OUTPUT_TRACE(Js::DebuggerPhase, _u("DiagNativeStackFrame::DiagNativeStackFrame: e.p(addr %p)=%p varOff=%d changedOff=%d\n"), codeAddr, entryPointInfo, m_localVarSlotsOffset, m_localVarChangedOffset);
    }